

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__slurp(char *filename,char *buf,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  
  if (len == 0) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x40c,"int uv__slurp(const char *, char *, size_t)");
  }
  iVar1 = uv__open_cloexec(filename,0);
  if (-1 < iVar1) {
    do {
      sVar2 = read(iVar1,buf,len - 1);
      if (sVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    iVar1 = uv__close_nocheckstdio(iVar1);
    if (iVar1 != 0) {
      abort();
    }
    if (sVar2 < 0) {
      piVar3 = __errno_location();
      iVar1 = -*piVar3;
    }
    else {
      buf[sVar2] = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int uv__slurp(const char* filename, char* buf, size_t len) {
  ssize_t n;
  int fd;

  assert(len > 0);

  fd = uv__open_cloexec(filename, O_RDONLY);
  if (fd < 0)
    return fd;

  do
    n = read(fd, buf, len - 1);
  while (n == -1 && errno == EINTR);

  if (uv__close_nocheckstdio(fd))
    abort();

  if (n < 0)
    return UV__ERR(errno);

  buf[n] = '\0';

  return 0;
}